

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

void __thiscall
ft::
list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::listInit(list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this)

{
  pointer plVar1;
  node *pnVar2;
  node *pnVar3;
  undefined1 *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  this_00 = &this->field_0x18;
  local_10 = this;
  plVar1 = allocator<ft::listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::allocate((allocator<ft::listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this_00,1);
  this->m_head = plVar1;
  plVar1 = allocator<ft::listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::allocate((allocator<ft::listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this_00,1);
  this->m_tail = plVar1;
  plVar1 = this->m_head;
  std::__cxx11::string::string((string *)&local_60);
  listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  listNode(&local_40,&local_60);
  allocator<ft::listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::construct((allocator<ft::listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00,plVar1,&local_40);
  listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~listNode(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  plVar1 = this->m_tail;
  std::__cxx11::string::string((string *)&local_c0);
  listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  listNode(&local_a0,&local_c0);
  allocator<ft::listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::construct((allocator<ft::listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&this->field_0x18,plVar1,&local_a0);
  listNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~listNode(&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  pnVar2 = tail(this);
  pnVar3 = head(this);
  pnVar3->next = pnVar2;
  pnVar2 = head(this);
  pnVar3 = tail(this);
  pnVar3->prev = pnVar2;
  return;
}

Assistant:

void listInit() {
		this->m_head = this->m_alloc.allocate(1);
		this->m_tail = this->m_alloc.allocate(1);
		this->m_alloc.construct(this->m_head, node());
		this->m_alloc.construct(this->m_tail, node());
		this->head()->next = this->tail();
		this->tail()->prev = this->head();
	}